

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectorhulls.cpp
# Opt level: O1

array<ImVec2,_4UL> *
VHMBBCalculate(array<ImVec2,_4UL> *__return_storage_ptr__,
              vector<ImVec2,_std::allocator<ImVec2>_> *hull,double psz)

{
  ImVec2 *pIVar1;
  ImVec2 *pIVar2;
  pointer pIVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  pointer pIVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ImVec2 IVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  ImVec2 IVar19;
  ImVec2 IVar20;
  ImVec2 IVar21;
  ImVec2 IVar22;
  ImVec2 IVar23;
  undefined1 auVar24 [16];
  float fVar25;
  float fVar30;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  double dVar39;
  double local_110;
  undefined8 local_f8;
  undefined8 local_e8;
  double local_c8;
  double local_a8;
  double local_90;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 uVar26;
  
  __return_storage_ptr__->_M_elems[2].x = 0.0;
  __return_storage_ptr__->_M_elems[2].y = 0.0;
  __return_storage_ptr__->_M_elems[3].x = 0.0;
  __return_storage_ptr__->_M_elems[3].y = 0.0;
  __return_storage_ptr__->_M_elems[0].x = 0.0;
  __return_storage_ptr__->_M_elems[0].y = 0.0;
  __return_storage_ptr__->_M_elems[1].x = 0.0;
  __return_storage_ptr__->_M_elems[1].y = 0.0;
  pIVar8 = (hull->super__Vector_base<ImVec2,_std::allocator<ImVec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pIVar3 = (hull->super__Vector_base<ImVec2,_std::allocator<ImVec2>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar9 = (long)pIVar3 - (long)pIVar8 >> 3;
  uVar26 = _DAT_001ec380;
  if (pIVar3 != pIVar8) {
    lVar11 = 0;
    auVar27 = _DAT_001ec380;
    do {
      auVar29._8_8_ = 0;
      auVar29._0_4_ = pIVar8[lVar11].x;
      auVar29._4_4_ = pIVar8[lVar11].y;
      auVar27 = minps(auVar29,auVar27);
      uVar26 = auVar27._0_8_;
      lVar11 = lVar11 + 1;
    } while (lVar9 + (ulong)(lVar9 == 0) != lVar11);
  }
  fVar25 = (float)uVar26;
  fVar30 = (float)((ulong)uVar26 >> 0x20);
  if (pIVar3 != pIVar8) {
    lVar11 = 0;
    do {
      IVar13.x = pIVar8[lVar11].x - fVar25;
      IVar13.y = pIVar8[lVar11].y - fVar30;
      pIVar8[lVar11] = IVar13;
      lVar11 = lVar11 + 1;
    } while (lVar9 + (ulong)(lVar9 == 0) != lVar11);
  }
  pIVar8 = (hull->super__Vector_base<ImVec2,_std::allocator<ImVec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar9 = (long)(hull->super__Vector_base<ImVec2,_std::allocator<ImVec2>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pIVar8;
  if (lVar9 == 0) {
    local_110 = 0.0;
    local_88 = 0;
    local_78 = 0;
  }
  else {
    uVar10 = lVar9 >> 3;
    local_78 = 0;
    local_90 = 1.79769313486232e+308;
    local_110 = 0.0;
    uVar12 = 0;
    dVar39 = 0.0;
    local_88 = 0;
    do {
      pIVar3 = pIVar8 + uVar12;
      uVar12 = uVar12 + 1;
      dVar14 = atan2((double)(pIVar8[(ulong)(long)(int)uVar12 % uVar10].y - (*pIVar3).y),
                     (double)(pIVar8[(ulong)(long)(int)uVar12 % uVar10].x - (*pIVar3).x));
      pIVar8 = (hull->super__Vector_base<ImVec2,_std::allocator<ImVec2>_>)._M_impl.
               super__Vector_impl_data._M_start;
      auVar27 = _DAT_001ec3a0;
      auVar29 = _DAT_001ec390;
      if ((hull->super__Vector_base<ImVec2,_std::allocator<ImVec2>_>)._M_impl.
          super__Vector_impl_data._M_finish != pIVar8) {
        local_c8 = -dVar14;
        uVar10 = 0;
        uVar31 = 0;
        uVar32 = 0x100000;
        uVar33 = 0;
        uVar34 = 0x100000;
        uVar35 = 0xffffffff;
        uVar36 = 0x7fefffff;
        uVar37 = 0xffffffff;
        uVar38 = 0x7fefffff;
        do {
          IVar13 = pIVar8[uVar10];
          dVar15 = (double)IVar13.x;
          cos(local_c8);
          local_f8._4_4_ = IVar13.y;
          local_e8 = (double)CONCAT44(local_f8._4_4_,local_f8._4_4_);
          dVar16 = sin(local_c8);
          dVar17 = sin(local_c8);
          dVar18 = cos(local_c8);
          IVar19.x = (float)(local_e8 * dVar15 + -dVar16 * (double)local_f8._4_4_);
          IVar19.y = (float)(dVar17 * dVar15 + dVar18 * (double)local_f8._4_4_);
          auVar28._0_8_ = (double)IVar19.x;
          auVar28._8_8_ = (double)IVar19.y;
          (hull->super__Vector_base<ImVec2,_std::allocator<ImVec2>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar10] = IVar19;
          auVar24._8_8_ = auVar28._8_8_;
          auVar24._0_8_ = auVar28._0_8_;
          auVar27._4_4_ = uVar32;
          auVar27._0_4_ = uVar31;
          auVar27._8_4_ = uVar33;
          auVar27._12_4_ = uVar34;
          auVar27 = maxpd(auVar24,auVar27);
          auVar7._4_4_ = uVar36;
          auVar7._0_4_ = uVar35;
          auVar7._8_4_ = uVar37;
          auVar7._12_4_ = uVar38;
          auVar29 = minpd(auVar28,auVar7);
          uVar10 = uVar10 + 1;
          pIVar8 = (hull->super__Vector_base<ImVec2,_std::allocator<ImVec2>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar31 = auVar27._0_4_;
          uVar32 = auVar27._4_4_;
          uVar33 = auVar27._8_4_;
          uVar34 = auVar27._12_4_;
          uVar35 = auVar29._0_4_;
          uVar36 = auVar29._4_4_;
          uVar37 = auVar29._8_4_;
          uVar38 = auVar29._12_4_;
        } while (uVar10 < (ulong)((long)(hull->super__Vector_base<ImVec2,_std::allocator<ImVec2>_>).
                                        _M_impl.super__Vector_impl_data._M_finish - (long)pIVar8 >>
                                 3));
      }
      dVar39 = dVar39 + dVar14;
      dVar14 = (auVar27._8_8_ - auVar29._8_8_) * (auVar27._0_8_ - auVar29._0_8_);
      if (dVar14 < local_90) {
        local_88 = CONCAT44((float)auVar29._8_8_,(float)auVar29._0_8_);
        local_78 = CONCAT44((float)auVar27._8_8_,(float)auVar27._0_8_);
        local_110 = dVar39;
        local_90 = dVar14;
      }
      pIVar8 = (hull->super__Vector_base<ImVec2,_std::allocator<ImVec2>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = (long)(hull->super__Vector_base<ImVec2,_std::allocator<ImVec2>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pIVar8 >> 3;
    } while (uVar12 < uVar10);
  }
  dVar39 = (double)(float)((double)(float)local_88 - psz);
  dVar14 = cos(local_110);
  dVar15 = (double)(float)((double)local_88._4_4_ - psz);
  local_a8 = sin(local_110);
  local_a8 = -local_a8;
  dVar16 = sin(local_110);
  dVar17 = cos(local_110);
  IVar20.x = (float)(dVar14 * dVar39 + local_a8 * dVar15);
  IVar20.y = (float)(dVar16 * dVar39 + dVar17 * dVar15);
  __return_storage_ptr__->_M_elems[0] = IVar20;
  dVar14 = (double)(float)((double)(float)local_78 + psz);
  dVar16 = cos(local_110);
  local_a8 = sin(local_110);
  local_a8 = -local_a8;
  dVar17 = sin(local_110);
  dVar18 = cos(local_110);
  IVar21.x = (float)(dVar16 * dVar14 + local_a8 * dVar15);
  IVar21.y = (float)(dVar17 * dVar14 + dVar18 * dVar15);
  __return_storage_ptr__->_M_elems[1] = IVar21;
  dVar15 = cos(local_110);
  dVar16 = (double)(float)((double)local_78._4_4_ + psz);
  local_f8 = sin(local_110);
  local_f8 = -local_f8;
  dVar17 = sin(local_110);
  dVar18 = cos(local_110);
  IVar22.x = (float)(dVar15 * dVar14 + local_f8 * dVar16);
  IVar22.y = (float)(dVar17 * dVar14 + dVar18 * dVar16);
  __return_storage_ptr__->_M_elems[2] = IVar22;
  dVar14 = cos(local_110);
  local_e8 = sin(local_110);
  local_e8 = -local_e8;
  dVar15 = sin(local_110);
  dVar17 = cos(local_110);
  IVar23.x = (float)(dVar14 * dVar39 + local_e8 * dVar16);
  IVar23.y = (float)(dVar15 * dVar39 + dVar17 * dVar16);
  __return_storage_ptr__->_M_elems[3] = IVar23;
  lVar9 = 0;
  do {
    pIVar1 = __return_storage_ptr__->_M_elems + lVar9;
    fVar4 = pIVar1->y;
    fVar5 = pIVar1[1].x;
    fVar6 = pIVar1[1].y;
    pIVar2 = __return_storage_ptr__->_M_elems + lVar9;
    pIVar2->x = pIVar1->x + fVar25;
    pIVar2->y = fVar4 + fVar30;
    pIVar2[1].x = fVar5 + fVar25;
    pIVar2[1].y = fVar6 + fVar30;
    lVar9 = lVar9 + 2;
  } while (lVar9 != 4);
  return __return_storage_ptr__;
}

Assistant:

std::array<ImVec2, 4> VHMBBCalculate(std::vector<ImVec2> hull, double psz) {
	std::array<ImVec2, 4> box;

	double mbAngle = 0, cumulative_angle = 0;
	double mbArea = DBL_MAX; // fake area to initialise
	ImVec2 mbb, mba, origin; // Box bottom left, box top right

	// Find the lowest hull point, if it's below the x-axis just bring it up to
	// compensate
	// NOTE: we're not modifying the actual hull point, just a copy
	origin.x = DBL_MAX;
	origin.y = DBL_MAX;

	// find bottom corner
	for (size_t i = 0; i < hull.size(); i++) {
		if (hull[i].y < origin.y) origin.y = hull[i].y;
		if (hull[i].x < origin.x) origin.x = hull[i].x;
	}

	// transpose
	for (size_t i = 0; i < hull.size(); i++) {
		hull[i].x -= origin.x;
		hull[i].y -= origin.y;
	}

	// rotate hull on each side and work out the smallest area
	for (size_t i = 0; i < hull.size(); i++) {
		int ni = i + 1;
		double area;

		ImVec2 current = hull[i];
		ImVec2 next    = hull[ni % hull.size()];

		double angle = VHAngleToX(current, next); // angle formed between current and next hull points;
		cumulative_angle += angle;

		double top, bot, left, right; // bounding rect limits
		top = right = DBL_MIN;
		bot = left = DBL_MAX;

		for (size_t x = 0; x < hull.size(); x++) {
			ImVec2 rp = VHRotateV(hull[x], -angle);

			hull[x] = rp;

			if (rp.y > top) top     = rp.y;
			if (rp.y < bot) bot     = rp.y;
			if (rp.x > right) right = rp.x;
			if (rp.x < left) left   = rp.x;
		}
		area = (right - left) * (top - bot);

		if (area < mbArea) {
			mbArea  = area;
			mbAngle = cumulative_angle; // total angle we've had to rotate the board
			                            // to get to this orientation;
			mba = ImVec2(left, bot);
			mbb = ImVec2(right, top);
		}
	} // for all points on hull

	// expand by pin size
	mba.x -= psz;
	mba.y -= psz;
	mbb.x += psz;
	mbb.y += psz;

	// Form our rectangle, has to be all 4 points as it's a polygon now that'll be
	// rotated
	box[0] = VHRotateV(mba, +mbAngle);
	box[1] = VHRotateV(ImVec2(mbb.x, mba.y), +mbAngle);
	box[2] = VHRotateV(mbb, +mbAngle);
	box[3] = VHRotateV(ImVec2(mba.x, mbb.y), +mbAngle);

	// Transpose MBB back
	for (size_t i = 0; i < 4; i++) {
		box[i].x += origin.x;
		box[i].y += origin.y;
	}

	return box;
}